

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O2

size_type __thiscall
cmsys::
hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::erase(hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
        *this,key_type *__key)

{
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var1;
  size_type sVar2;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var3;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var4;
  size_type sVar5;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var6;
  
  sVar2 = _M_bkt_num_key(this,__key);
  p_Var1 = (this->_M_buckets).
           super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar2];
  if (p_Var1 == (_Hashtable_node<std::pair<const_char_*const,_int>_> *)0x0) {
    return 0;
  }
  p_Var3 = p_Var1->_M_next;
  sVar5 = 0;
  p_Var6 = p_Var1;
  do {
    p_Var4 = p_Var6;
    do {
      p_Var6 = p_Var4;
      p_Var4 = p_Var3;
      if (p_Var4 == (_Hashtable_node<std::pair<const_char_*const,_int>_> *)0x0) {
        if ((p_Var1->_M_val).first != *__key) {
          return sVar5;
        }
        (this->_M_buckets).
        super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar2] = p_Var1->_M_next;
        operator_delete(p_Var1,0x18);
        this->_M_num_elements = this->_M_num_elements - 1;
        return sVar5 + 1;
      }
      p_Var3 = p_Var4->_M_next;
    } while ((p_Var4->_M_val).first != *__key);
    p_Var6->_M_next = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var3 = p_Var6->_M_next;
    sVar5 = sVar5 + 1;
    this->_M_num_elements = this->_M_num_elements - 1;
  } while( true );
}

Assistant:

typename hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::size_type
hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::erase(const key_type& __key)
{
  const size_type __n = _M_bkt_num_key(__key);
  _Node* __first = _M_buckets[__n];
  size_type __erased = 0;

  if (__first) {
    _Node* __cur = __first;
    _Node* __next = __cur->_M_next;
    while (__next) {
      if (_M_equals(_M_get_key(__next->_M_val), __key)) {
        __cur->_M_next = __next->_M_next;
        _M_delete_node(__next);
        __next = __cur->_M_next;
        ++__erased;
        --_M_num_elements;
      }
      else {
        __cur = __next;
        __next = __cur->_M_next;
      }
    }
    if (_M_equals(_M_get_key(__first->_M_val), __key)) {
      _M_buckets[__n] = __first->_M_next;
      _M_delete_node(__first);
      ++__erased;
      --_M_num_elements;
    }
  }
  return __erased;
}